

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall psy::C::Lexer::lexBackslash(Lexer *this,SyntaxKind syntaxK)

{
  byte bVar1;
  int iVar2;
  
  yyinput(this);
  if ((this->yychar_ != 0) && (iVar2 = isspace((uint)this->yychar_), iVar2 == 0)) {
    yyinput(this);
    return;
  }
  do {
    bVar1 = this->yychar_;
    if (bVar1 == 10) {
LAB_002bcd7c:
      do {
        yyinput(this);
        bVar1 = this->yychar_;
        if (bVar1 == 10) {
          return;
        }
        iVar2 = isspace((uint)bVar1);
      } while (iVar2 != 0);
      if (bVar1 == 0) {
        this->syntaxK_splitTk = syntaxK;
      }
      return;
    }
    iVar2 = isspace((uint)bVar1);
    if (iVar2 == 0) {
      if (bVar1 != 10) {
        if (bVar1 != 0) {
          return;
        }
        this->syntaxK_splitTk = syntaxK;
        this->withinLogicalLine_ = true;
        return;
      }
      goto LAB_002bcd7c;
    }
    yyinput(this);
  } while( true );
}

Assistant:

void Lexer::lexBackslash(SyntaxKind syntaxK)
{
    yyinput();
    if (yychar_ && !std::isspace(yychar_)) {
        yyinput();
        return;
    }

    while (yychar_ != '\n' && std::isspace(yychar_))
        yyinput();

    if (!yychar_) {
        syntaxK_splitTk = syntaxK;
        withinLogicalLine_ = true;
        return;
    }

    if (yychar_ == '\n') {
        yyinput();
        while (yychar_ != '\n' && std::isspace(yychar_))
            yyinput();

        if (!yychar_)
            syntaxK_splitTk = syntaxK;
    }
}